

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

size_t __thiscall cxxopts::ParseResult::count(ParseResult *this,string *o)

{
  bool bVar1;
  pointer pvVar2;
  const_iterator riter;
  const_iterator iter;
  unordered_map<std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue,_std::hash<std::shared_ptr<cxxopts::OptionDetails>_>,_std::equal_to<std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>_>_>
  *in_stack_ffffffffffffffb8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  local_20 [3];
  size_t local_8;
  
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
               *)in_stack_ffffffffffffffb8,(key_type *)0x1304d5);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
              *)in_stack_ffffffffffffffb8);
  bVar1 = std::__detail::operator==(local_20,&local_28);
  if (bVar1) {
    local_8 = 0;
  }
  else {
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
    ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
                  *)0x130527);
    std::
    unordered_map<std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue,_std::hash<std::shared_ptr<cxxopts::OptionDetails>_>,_std::equal_to<std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>_>_>
    ::find(in_stack_ffffffffffffffb8,(key_type *)0x130538);
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>,_false,_false>
                           *)0x130547);
    local_8 = OptionValue::count(&pvVar2->second);
  }
  return local_8;
}

Assistant:

size_t
        count(const std::string& o) const
        {
            auto iter = m_options.find(o);
            if (iter == m_options.end())
            {
                return 0;
            }

            auto riter = m_results.find(iter->second);

            return riter->second.count();
        }